

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

Point2f pbrt::InvertSphericalRectangleSample
                  (Point3f *pRef,Point3f *s,Vector3f *ex,Vector3f *ey,Point3f *pRect)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  int iVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  Tuple2<pbrt::Point2,_float> TVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  undefined1 auVar47 [16];
  float fVar48;
  float fVar49;
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  float fVar55;
  undefined1 auVar56 [16];
  float fVar57;
  float fVar58;
  undefined1 auVar59 [16];
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 local_128 [16];
  undefined1 local_c8 [16];
  float local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  float fVar50;
  
  fVar21 = (ex->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar11 = ZEXT416((uint)(ex->super_Tuple3<pbrt::Vector3,_float>).x);
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * fVar21)),auVar11,auVar11);
  auVar7 = ZEXT416((uint)(ex->super_Tuple3<pbrt::Vector3,_float>).z);
  auVar11 = vfmadd213ss_fma(auVar7,auVar7,auVar11);
  if (auVar11._0_4_ < 0.0) {
    fVar21 = sqrtf(auVar11._0_4_);
  }
  else {
    auVar11 = vsqrtss_avx(auVar11,auVar11);
    fVar21 = auVar11._0_4_;
  }
  fVar49 = (ey->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar11 = ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).x);
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar49 * fVar49)),auVar11,auVar11);
  auVar7 = ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).z);
  auVar11 = vfmadd213ss_fma(auVar7,auVar7,auVar11);
  if (auVar11._0_4_ < 0.0) {
    fVar49 = sqrtf(auVar11._0_4_);
  }
  else {
    auVar11 = vsqrtss_avx(auVar11,auVar11);
    fVar49 = auVar11._0_4_;
  }
  fVar58 = (ex->super_Tuple3<pbrt::Vector3,_float>).x / fVar21;
  auVar7 = ZEXT416((uint)fVar58);
  fVar61 = (ex->super_Tuple3<pbrt::Vector3,_float>).y / fVar21;
  fVar60 = (ex->super_Tuple3<pbrt::Vector3,_float>).z / fVar21;
  auVar38 = ZEXT416((uint)fVar60);
  fVar54 = (ey->super_Tuple3<pbrt::Vector3,_float>).x / fVar49;
  auVar8 = ZEXT416((uint)fVar54);
  fVar57 = (ey->super_Tuple3<pbrt::Vector3,_float>).y / fVar49;
  fVar50 = (ey->super_Tuple3<pbrt::Vector3,_float>).z / fVar49;
  auVar52 = ZEXT416((uint)fVar50);
  auVar9 = vfmsub213ss_fma(auVar52,ZEXT416((uint)fVar61),ZEXT416((uint)(fVar60 * fVar57)));
  auVar6 = vfnmadd231ss_fma(ZEXT416((uint)(fVar60 * fVar57)),auVar38,ZEXT416((uint)fVar57));
  auVar11 = ZEXT416((uint)(fVar58 * fVar50));
  auVar25 = vfmsub213ss_fma(auVar8,auVar38,auVar11);
  auVar47 = vfnmadd231ss_fma(auVar11,auVar7,auVar52);
  auVar10 = vfmsub213ss_fma(ZEXT416((uint)fVar57),auVar7,ZEXT416((uint)(fVar61 * fVar54)));
  auVar56 = vfnmadd231ss_fma(ZEXT416((uint)(fVar61 * fVar54)),ZEXT416((uint)fVar61),auVar8);
  fVar50 = (s->super_Tuple3<pbrt::Point3,_float>).x - (pRef->super_Tuple3<pbrt::Point3,_float>).x;
  fVar46 = (s->super_Tuple3<pbrt::Point3,_float>).y - (pRef->super_Tuple3<pbrt::Point3,_float>).y;
  fVar37 = (s->super_Tuple3<pbrt::Point3,_float>).z - (pRef->super_Tuple3<pbrt::Point3,_float>).z;
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar61 * fVar46)),ZEXT416((uint)fVar50),auVar7);
  auVar7 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar37),auVar38);
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar57 * fVar46)),ZEXT416((uint)fVar50),auVar8);
  auVar8 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar37),auVar52);
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)((auVar25._0_4_ + auVar47._0_4_) * fVar46)),
                            ZEXT416((uint)fVar50),ZEXT416((uint)(auVar9._0_4_ + auVar6._0_4_)));
  auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar37),
                            ZEXT416((uint)(auVar10._0_4_ + auVar56._0_4_)));
  auVar9._0_8_ = auVar11._0_8_ ^ 0x8000000080000000;
  auVar9._8_4_ = auVar11._8_4_ ^ 0x80000000;
  auVar9._12_4_ = auVar11._12_4_ ^ 0x80000000;
  auVar11 = vminss_avx(auVar9,auVar11);
  fVar62 = auVar7._0_4_;
  fVar21 = fVar21 + fVar62;
  fVar22 = auVar8._0_4_;
  fVar49 = fVar22 + fVar49;
  fVar23 = auVar11._0_4_;
  fVar55 = fVar22 * fVar23;
  auVar9 = vfmsub213ss_fma(auVar11,auVar8,ZEXT416((uint)fVar55));
  auVar47._0_8_ = auVar11._0_8_ ^ 0x8000000080000000;
  auVar47._8_4_ = auVar11._8_4_ ^ 0x80000000;
  auVar47._12_4_ = auVar11._12_4_ ^ 0x80000000;
  auVar25 = vfnmadd213ss_fma(auVar8,auVar11,ZEXT416((uint)fVar55));
  fVar50 = auVar9._0_4_ + auVar25._0_4_;
  fVar51 = fVar62 * fVar23;
  auVar9 = vfmsub213ss_fma(ZEXT416((uint)fVar21),auVar11,ZEXT416((uint)fVar51));
  auVar10 = vfnmadd213ss_fma(auVar11,auVar7,ZEXT416((uint)fVar51));
  fVar46 = auVar9._0_4_ + auVar10._0_4_;
  fVar37 = fVar22 * fVar21;
  auVar56._0_4_ = -fVar37;
  auVar56._4_4_ = 0x80000000;
  auVar56._8_4_ = 0x80000000;
  auVar56._12_4_ = 0x80000000;
  auVar9 = vfmsub213ss_fma(auVar8,auVar7,ZEXT416((uint)fVar37));
  auVar6 = vfnmadd231ss_fma(ZEXT416((uint)fVar37),auVar8,ZEXT416((uint)fVar21));
  fVar37 = auVar9._0_4_ + auVar6._0_4_;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * fVar46)),ZEXT416((uint)fVar50),
                           ZEXT416((uint)fVar50));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar37),ZEXT416((uint)fVar37));
  if (auVar8._0_4_ < 0.0) {
    fVar18 = sqrtf(auVar8._0_4_);
  }
  else {
    auVar8 = vsqrtss_avx(auVar8,auVar8);
    fVar18 = auVar8._0_4_;
  }
  local_c8._4_4_ = 0x80000000;
  local_c8._0_4_ = -fVar55;
  local_c8._8_4_ = 0x80000000;
  local_c8._12_4_ = 0x80000000;
  local_128._4_4_ = 0x80000000;
  local_128._0_4_ = -fVar51;
  local_128._8_4_ = 0x80000000;
  local_128._12_4_ = 0x80000000;
  fVar55 = fVar49 * fVar23;
  auVar59._0_4_ = -fVar55;
  auVar59._4_4_ = 0x80000000;
  auVar59._8_4_ = 0x80000000;
  auVar59._12_4_ = 0x80000000;
  auVar9 = vfmsub132ss_fma(auVar11,ZEXT416((uint)fVar55),ZEXT416((uint)fVar22));
  auVar8 = vfmadd213ss_fma(auVar47,ZEXT416((uint)fVar49),ZEXT416((uint)fVar55));
  fVar55 = auVar9._0_4_ + auVar8._0_4_;
  fVar51 = fVar21 * fVar23;
  auVar53._0_4_ = -fVar51;
  auVar53._4_4_ = 0x80000000;
  auVar53._8_4_ = 0x80000000;
  auVar53._12_4_ = 0x80000000;
  auVar38 = ZEXT416((uint)fVar21);
  auVar9 = vfmsub213ss_fma(auVar38,auVar11,ZEXT416((uint)fVar51));
  auVar47 = vfnmadd231ss_fma(ZEXT416((uint)fVar51),auVar38,auVar11);
  fVar51 = auVar47._0_4_ + auVar9._0_4_;
  auVar9 = vfmadd231ss_fma(auVar56,auVar38,ZEXT416((uint)fVar49));
  fVar48 = auVar9._0_4_ + auVar6._0_4_;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * fVar51)),ZEXT416((uint)fVar55),
                           ZEXT416((uint)fVar55));
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar48),ZEXT416((uint)fVar48));
  if (auVar9._0_4_ < 0.0) {
    fVar19 = sqrtf(auVar9._0_4_);
  }
  else {
    auVar9 = vsqrtss_avx(auVar9,auVar9);
    fVar19 = auVar9._0_4_;
  }
  auVar9 = vfmadd231ss_fma(auVar59,ZEXT416((uint)fVar49),auVar11);
  fVar15 = auVar9._0_4_ + auVar8._0_4_;
  auVar8 = vfmadd231ss_fma(auVar53,auVar11,auVar7);
  fVar16 = auVar47._0_4_ + auVar8._0_4_;
  fVar17 = fVar62 * fVar49;
  auVar8._8_4_ = 0x80000000;
  auVar8._0_8_ = 0x8000000080000000;
  auVar8._12_4_ = 0x80000000;
  auVar6 = vxorps_avx512vl(ZEXT416((uint)fVar17),auVar8);
  auVar8 = vfmsub132ss_fma(ZEXT416((uint)fVar49),ZEXT416((uint)fVar17),ZEXT416((uint)fVar21));
  auVar9 = vfnmadd231ss_fma(ZEXT416((uint)fVar17),ZEXT416((uint)fVar49),auVar7);
  fVar17 = auVar9._0_4_ + auVar8._0_4_;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * fVar16)),ZEXT416((uint)fVar15),
                           ZEXT416((uint)fVar15));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar17),ZEXT416((uint)fVar17));
  if (auVar8._0_4_ < 0.0) {
    fVar13 = sqrtf(auVar8._0_4_);
  }
  else {
    auVar8 = vsqrtss_avx(auVar8,auVar8);
    fVar13 = auVar8._0_4_;
  }
  fVar50 = fVar50 / fVar18;
  fVar46 = fVar46 / fVar18;
  fVar37 = fVar37 / fVar18;
  fVar55 = fVar55 / fVar19;
  fVar51 = fVar51 / fVar19;
  fVar48 = fVar48 / fVar19;
  auVar8 = vfmadd231ss_fma(local_c8,auVar11,ZEXT416((uint)fVar49));
  fVar18 = auVar8._0_4_ + auVar25._0_4_;
  auVar11 = vfmadd231ss_fma(local_128,auVar11,auVar7);
  fVar19 = auVar11._0_4_ + auVar10._0_4_;
  auVar11 = vfmadd231ss_fma(auVar6,auVar7,ZEXT416((uint)fVar22));
  fVar20 = auVar11._0_4_ + auVar9._0_4_;
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * fVar19)),ZEXT416((uint)fVar18),
                            ZEXT416((uint)fVar18));
  auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar20),ZEXT416((uint)fVar20));
  if (auVar11._0_4_ < 0.0) {
    fVar14 = sqrtf(auVar11._0_4_);
  }
  else {
    auVar11 = vsqrtss_avx(auVar11,auVar11);
    fVar14 = auVar11._0_4_;
  }
  fVar15 = fVar15 / fVar13;
  fVar16 = fVar16 / fVar13;
  auVar25._0_4_ = fVar17 / fVar13;
  auVar25._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar11 = vfnmsub231ss_fma(ZEXT416((uint)(fVar51 * fVar46)),ZEXT416((uint)fVar50),
                             ZEXT416((uint)fVar55));
  auVar11 = vfnmadd231ss_fma(auVar11,ZEXT416((uint)fVar37),ZEXT416((uint)fVar48));
  if (0.0 <= auVar11._0_4_) {
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)((fVar51 + fVar46) * (fVar51 + fVar46))),
                              ZEXT416((uint)(fVar55 + fVar50)),ZEXT416((uint)(fVar55 + fVar50)));
    auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)(fVar48 + fVar37)),
                              ZEXT416((uint)(fVar48 + fVar37)));
    if (auVar11._0_4_ < 0.0) {
      fVar17 = sqrtf(auVar11._0_4_);
    }
    else {
      auVar11 = vsqrtss_avx(auVar11,auVar11);
      fVar17 = auVar11._0_4_;
    }
    auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar17 * 0.5)));
    uVar1 = vcmpss_avx512f(ZEXT416((uint)(fVar17 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar3 = (bool)((byte)uVar1 & 1);
    fVar17 = asinf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar11._0_4_));
    fVar17 = fVar17 + fVar17;
  }
  else {
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)((fVar51 - fVar46) * (fVar51 - fVar46))),
                              ZEXT416((uint)(fVar55 - fVar50)),ZEXT416((uint)(fVar55 - fVar50)));
    auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)(fVar48 - fVar37)),
                              ZEXT416((uint)(fVar48 - fVar37)));
    if (auVar11._0_4_ < 0.0) {
      fVar17 = sqrtf(auVar11._0_4_);
    }
    else {
      auVar11 = vsqrtss_avx(auVar11,auVar11);
      fVar17 = auVar11._0_4_;
    }
    auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar17 * 0.5)));
    uVar1 = vcmpss_avx512f(ZEXT416((uint)(fVar17 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar3 = (bool)((byte)uVar1 & 1);
    auVar29._0_4_ = asinf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar11._0_4_));
    auVar29._4_60_ = extraout_var;
    auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar29._0_16_,ZEXT416(0x40490fdb));
    fVar17 = auVar11._0_4_;
  }
  fVar18 = fVar18 / fVar14;
  fVar19 = fVar19 / fVar14;
  fVar20 = fVar20 / fVar14;
  auVar11 = vfnmsub231ss_fma(ZEXT416((uint)(fVar16 * fVar51)),ZEXT416((uint)fVar55),
                             ZEXT416((uint)fVar15));
  auVar11 = vfnmadd231ss_fma(auVar11,ZEXT416((uint)fVar48),auVar25);
  if (0.0 <= auVar11._0_4_) {
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)((fVar16 + fVar51) * (fVar16 + fVar51))),
                              ZEXT416((uint)(fVar15 + fVar55)),ZEXT416((uint)(fVar15 + fVar55)));
    auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)(auVar25._0_4_ + fVar48)),
                              ZEXT416((uint)(auVar25._0_4_ + fVar48)));
    if (auVar11._0_4_ < 0.0) {
      fVar55 = sqrtf(auVar11._0_4_);
    }
    else {
      auVar11 = vsqrtss_avx(auVar11,auVar11);
      fVar55 = auVar11._0_4_;
    }
    auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar55 * 0.5)));
    uVar1 = vcmpss_avx512f(ZEXT416((uint)(fVar55 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar3 = (bool)((byte)uVar1 & 1);
    fVar55 = asinf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar11._0_4_));
    fVar55 = fVar55 + fVar55;
  }
  else {
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)((fVar16 - fVar51) * (fVar16 - fVar51))),
                              ZEXT416((uint)(fVar15 - fVar55)),ZEXT416((uint)(fVar15 - fVar55)));
    auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)(auVar25._0_4_ - fVar48)),
                              ZEXT416((uint)(auVar25._0_4_ - fVar48)));
    if (auVar11._0_4_ < 0.0) {
      fVar55 = sqrtf(auVar11._0_4_);
    }
    else {
      auVar11 = vsqrtss_avx(auVar11,auVar11);
      fVar55 = auVar11._0_4_;
    }
    auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar55 * 0.5)));
    uVar1 = vcmpss_avx512f(ZEXT416((uint)(fVar55 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar3 = (bool)((byte)uVar1 & 1);
    auVar30._0_4_ = asinf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar11._0_4_));
    auVar30._4_60_ = extraout_var_00;
    auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar30._0_16_,ZEXT416(0x40490fdb));
    fVar55 = auVar11._0_4_;
  }
  auVar11 = vfnmsub231ss_fma(ZEXT416((uint)(fVar19 * fVar16)),ZEXT416((uint)fVar15),
                             ZEXT416((uint)fVar18));
  auVar11 = vfnmadd231ss_fma(auVar11,auVar25,ZEXT416((uint)fVar20));
  if (0.0 <= auVar11._0_4_) {
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)((fVar19 + fVar16) * (fVar19 + fVar16))),
                              ZEXT416((uint)(fVar18 + fVar15)),ZEXT416((uint)(fVar18 + fVar15)));
    auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)(fVar20 + auVar25._0_4_)),
                              ZEXT416((uint)(fVar20 + auVar25._0_4_)));
    if (auVar11._0_4_ < 0.0) {
      fVar51 = sqrtf(auVar11._0_4_);
    }
    else {
      auVar11 = vsqrtss_avx(auVar11,auVar11);
      fVar51 = auVar11._0_4_;
    }
    auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar51 * 0.5)));
    uVar1 = vcmpss_avx512f(ZEXT416((uint)(fVar51 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar3 = (bool)((byte)uVar1 & 1);
    fVar51 = asinf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar11._0_4_));
    fVar51 = fVar51 + fVar51;
  }
  else {
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)((fVar19 - fVar16) * (fVar19 - fVar16))),
                              ZEXT416((uint)(fVar18 - fVar15)),ZEXT416((uint)(fVar18 - fVar15)));
    auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)(fVar20 - auVar25._0_4_)),
                              ZEXT416((uint)(fVar20 - auVar25._0_4_)));
    if (auVar11._0_4_ < 0.0) {
      fVar51 = sqrtf(auVar11._0_4_);
    }
    else {
      auVar11 = vsqrtss_avx(auVar11,auVar11);
      fVar51 = auVar11._0_4_;
    }
    auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar51 * 0.5)));
    uVar1 = vcmpss_avx512f(ZEXT416((uint)(fVar51 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar3 = (bool)((byte)uVar1 & 1);
    auVar31._0_4_ = asinf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar11._0_4_));
    auVar31._4_60_ = extraout_var_01;
    auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar31._0_16_,ZEXT416(0x40490fdb));
    fVar51 = auVar11._0_4_;
  }
  auVar11 = vfnmsub231ss_fma(ZEXT416((uint)(fVar46 * fVar19)),ZEXT416((uint)fVar18),
                             ZEXT416((uint)fVar50));
  auVar11 = vfnmadd231ss_fma(auVar11,ZEXT416((uint)fVar20),ZEXT416((uint)fVar37));
  if (0.0 <= auVar11._0_4_) {
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)((fVar46 + fVar19) * (fVar46 + fVar19))),
                              ZEXT416((uint)(fVar50 + fVar18)),ZEXT416((uint)(fVar50 + fVar18)));
    auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)(fVar37 + fVar20)),
                              ZEXT416((uint)(fVar37 + fVar20)));
    if (auVar11._0_4_ < 0.0) {
      fVar50 = sqrtf(auVar11._0_4_);
    }
    else {
      auVar11 = vsqrtss_avx(auVar11,auVar11);
      fVar50 = auVar11._0_4_;
    }
    auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar50 * 0.5)));
    uVar1 = vcmpss_avx512f(ZEXT416((uint)(fVar50 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar3 = (bool)((byte)uVar1 & 1);
    fVar50 = asinf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar11._0_4_));
    fVar50 = fVar50 + fVar50;
  }
  else {
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)((fVar46 - fVar19) * (fVar46 - fVar19))),
                              ZEXT416((uint)(fVar50 - fVar18)),ZEXT416((uint)(fVar50 - fVar18)));
    auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)(fVar37 - fVar20)),
                              ZEXT416((uint)(fVar37 - fVar20)));
    if (auVar11._0_4_ < 0.0) {
      fVar50 = sqrtf(auVar11._0_4_);
    }
    else {
      auVar11 = vsqrtss_avx(auVar11,auVar11);
      fVar50 = auVar11._0_4_;
    }
    auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar50 * 0.5)));
    uVar1 = vcmpss_avx512f(ZEXT416((uint)(fVar50 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar3 = (bool)((byte)uVar1 & 1);
    auVar32._0_4_ = asinf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar11._0_4_));
    auVar32._4_60_ = extraout_var_02;
    auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar32._0_16_,ZEXT416(0x40490fdb));
    fVar50 = auVar11._0_4_;
  }
  fVar46 = fVar17 + fVar55 + fVar51 + fVar50 + -6.2831855;
  if (0.001 <= fVar46) {
    fVar55 = (pRect->super_Tuple3<pbrt::Point3,_float>).x -
             (pRef->super_Tuple3<pbrt::Point3,_float>).x;
    fVar18 = (pRect->super_Tuple3<pbrt::Point3,_float>).y -
             (pRef->super_Tuple3<pbrt::Point3,_float>).y;
    fVar48 = (pRect->super_Tuple3<pbrt::Point3,_float>).z -
             (pRef->super_Tuple3<pbrt::Point3,_float>).z;
    auVar11 = vfmadd213ss_fma(ZEXT416((uint)fVar58),ZEXT416((uint)fVar55),
                              ZEXT416((uint)(fVar18 * fVar61)));
    auVar8 = vfmadd213ss_fma(ZEXT416((uint)fVar60),ZEXT416((uint)fVar48),auVar11);
    auVar11 = vminss_avx(ZEXT416((uint)fVar21),auVar8);
    uVar1 = vcmpss_avx512f(auVar8,auVar7,1);
    bVar3 = (bool)((byte)uVar1 & 1);
    auVar11._0_4_ = (uint)bVar3 * (int)fVar62 + (uint)!bVar3 * auVar11._0_4_;
    uVar1 = vcmpss_avx512f(auVar11,ZEXT816(0) << 0x20,0);
    bVar3 = (bool)((byte)uVar1 & 1);
    fVar58 = (float)((uint)bVar3 * 0x2edbe6ff + (uint)!bVar3 * auVar11._0_4_);
    fVar21 = ((fVar23 * fVar23) / (fVar58 * fVar58) + 1.0) - fVar37 * fVar37;
    if (fVar21 < 0.0) {
      auVar33._0_4_ = sqrtf(fVar21);
      auVar33._4_60_ = extraout_var_03;
      auVar11 = auVar33._0_16_;
    }
    else {
      auVar11 = vsqrtss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
    }
    if (InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
        ::reg == '\0') {
      iVar5 = __cxa_guard_acquire(&InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
                                   ::reg);
      if (iVar5 != 0) {
        StatRegisterer::StatRegisterer
                  ((StatRegisterer *)
                   &InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
                    ::reg,InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::
                          Point3<float>const&,pbrt::Vector3<float>const&,pbrt::
                          Vector3<float>const&,pbrt::Point3<float>const&)::$_0::__invoke(pbrt::
                          StatsAccumulator__,(PixelAccumFunc)0x0);
        __cxa_guard_release(&InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
                             ::reg);
      }
    }
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar7 = vxorps_avx512vl(auVar25,auVar7);
    auVar10._8_4_ = 0x7fffffff;
    auVar10._0_8_ = 0x7fffffff7fffffff;
    auVar10._12_4_ = 0x7fffffff;
    auVar8 = vpternlogd_avx512vl(ZEXT416((uint)fVar58),auVar11,auVar10,0xd8);
    *(long *)(in_FS_OFFSET + -0x438) = *(long *)(in_FS_OFFSET + -0x438) + 1;
    fVar60 = auVar8._0_4_;
    if ((fVar60 == 0.0) && (!NAN(fVar60))) {
      *(long *)(in_FS_OFFSET + -0x440) = *(long *)(in_FS_OFFSET + -0x440) + 1;
    }
    auVar10 = vfmsub213ss_fma(ZEXT416((uint)fVar37),ZEXT416((uint)fVar37),
                              ZEXT416((uint)(auVar25._0_4_ * auVar25._0_4_)));
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar25._0_4_ * auVar25._0_4_)),auVar7,auVar25);
    auVar9 = vmaxss_avx(ZEXT416((uint)(auVar10._0_4_ + auVar9._0_4_ + fVar21)),(undefined1  [16])0x0
                       );
    if (auVar9._0_4_ < 0.0) {
      fVar21 = sqrtf(auVar9._0_4_);
    }
    else {
      auVar9 = vsqrtss_avx(auVar9,auVar9);
      fVar21 = auVar9._0_4_;
    }
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar9 = vxorps_avx512vl(auVar8,auVar6);
    auVar38._8_4_ = 0x7fffffff;
    auVar38._0_8_ = 0x7fffffff7fffffff;
    auVar38._12_4_ = 0x7fffffff;
    auVar10 = vpternlogd_avx512vl(ZEXT416((uint)(fVar37 * auVar9._0_4_)),auVar38,
                                  ZEXT416((uint)(fVar37 * fVar21)),0xb8);
    auVar7 = vfmadd213ss_fma(auVar7,auVar8,auVar10);
    auVar11 = vpand_avx(auVar38,auVar11);
    auVar11 = vfmsub213ss_fma(auVar25,ZEXT416((uint)fVar37),ZEXT416((uint)(auVar11._0_4_ * fVar21)))
    ;
    auVar34._0_4_ = atan2f(auVar7._0_4_,auVar11._0_4_);
    auVar34._4_60_ = extraout_var_04;
    fVar21 = fVar58 * fVar58 + fVar23 * fVar23;
    if (fVar21 < 0.0) {
      fVar37 = sqrtf(fVar21);
    }
    else {
      auVar11 = vsqrtss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
      fVar37 = auVar11._0_4_;
    }
    uVar1 = vcmpss_avx512f(ZEXT816(0) << 0x40,auVar34._0_16_,1);
    auVar11 = vfmadd132ss_fma(ZEXT416((uint)fVar54),ZEXT416((uint)(fVar18 * fVar57)),
                              ZEXT416((uint)fVar55));
    fVar55 = fVar21 + fVar22 * fVar22;
    if (fVar55 < 0.0) {
      fVar55 = sqrtf(fVar55);
      auVar11 = ZEXT416(auVar11._0_4_);
    }
    else {
      auVar7 = vsqrtss_avx(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
      fVar55 = auVar7._0_4_;
    }
    uVar2 = vcmpss_avx512f(auVar9,ZEXT416((uint)fVar60),0);
    auVar11 = vfmadd132ss_fma(auVar52,auVar11,ZEXT416((uint)fVar48));
    fVar22 = fVar22 / fVar55;
    auVar7 = ZEXT416((uint)fVar22);
    fVar55 = fVar49 * fVar49 + fVar21;
    if (fVar55 < 0.0) {
      fVar55 = sqrtf(fVar55);
    }
    else {
      auVar8 = vsqrtss_avx(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
      fVar55 = auVar8._0_4_;
    }
    fVar49 = fVar49 / fVar55;
    local_38 = auVar11._0_4_;
    auVar11 = vfmsub213ss_fma(auVar7,auVar7,ZEXT416((uint)(fVar22 * fVar49)));
    auVar7 = vfnmadd231ss_fma(ZEXT416((uint)(fVar22 * fVar49)),auVar7,ZEXT416((uint)fVar49));
    fVar55 = auVar11._0_4_ + auVar7._0_4_;
    fVar54 = fVar22 - fVar49;
    auVar52._8_4_ = 0x7fffffff;
    auVar52._0_8_ = 0x7fffffff7fffffff;
    auVar52._12_4_ = 0x7fffffff;
    auVar11 = vandps_avx512vl(ZEXT416((uint)fVar54),auVar52);
    fVar21 = local_38 * local_38 + fVar21;
    fVar23 = local_38 * local_38 * fVar21;
    if (fVar23 < 0.0) {
      fVar57 = sqrtf(fVar23);
    }
    else {
      auVar7 = vsqrtss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23));
      fVar57 = auVar7._0_4_;
    }
    fVar54 = fVar54 * fVar54;
    if (fVar23 < 0.0) {
      fVar23 = sqrtf(fVar23);
    }
    else {
      auVar7 = vsqrtss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23));
      fVar23 = auVar7._0_4_;
    }
    auVar11 = vinsertps_avx(ZEXT416((uint)(fVar55 - (fVar57 * auVar11._0_4_) / fVar21)),
                            ZEXT416((uint)(fVar55 + (fVar23 * auVar11._0_4_) / fVar21)),0x10);
    auVar39._4_4_ = fVar54;
    auVar39._0_4_ = fVar54;
    auVar39._8_4_ = fVar54;
    auVar39._12_4_ = fVar54;
    auVar42._8_4_ = 0x3f800000;
    auVar42._0_8_ = 0x3f8000003f800000;
    auVar42._12_4_ = 0x3f800000;
    auVar11 = vdivps_avx(auVar11,auVar39);
    auVar7 = vsubps_avx(auVar42,auVar11);
    auVar40._0_4_ = fVar49 * auVar11._0_4_;
    auVar40._4_4_ = fVar49 * auVar11._4_4_;
    auVar40._8_4_ = fVar49 * auVar11._8_4_;
    auVar40._12_4_ = fVar49 * auVar11._12_4_;
    auVar43._4_4_ = fVar22;
    auVar43._0_4_ = fVar22;
    auVar43._8_4_ = fVar22;
    auVar43._12_4_ = fVar22;
    auVar7 = vfmadd213ps_fma(auVar43,auVar7,auVar40);
    fVar21 = auVar7._0_4_;
    auVar27._0_4_ = fVar21 * fVar21;
    fVar49 = auVar7._4_4_;
    auVar27._4_4_ = fVar49 * fVar49;
    fVar55 = auVar7._8_4_;
    auVar27._8_4_ = fVar55 * fVar55;
    fVar22 = auVar7._12_4_;
    auVar27._12_4_ = fVar22 * fVar22;
    auVar7 = vmovshdup_avx(auVar27);
    fVar23 = 1.0 - auVar27._0_4_;
    if (fVar23 < 0.0) {
      auVar35._0_4_ = sqrtf(fVar23);
      auVar35._4_60_ = extraout_var_05;
      auVar8 = auVar35._0_16_;
    }
    else {
      auVar8 = vsqrtss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23));
    }
    auVar44._0_4_ = fVar37 * fVar21;
    auVar44._4_4_ = fVar37 * fVar49;
    auVar44._8_4_ = fVar37 * fVar55;
    auVar44._12_4_ = fVar37 * fVar22;
    fVar21 = 1.0 - auVar7._0_4_;
    if (fVar21 < 0.0) {
      auVar36._0_4_ = sqrtf(fVar21);
      auVar36._4_60_ = extraout_var_06;
      auVar7 = auVar36._0_16_;
    }
    else {
      auVar7 = vsqrtss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
    }
    auVar25 = ZEXT416((uint)((fVar50 + (float)((uint)((byte)uVar2 & 1) * 0x40490fdb +
                                              (uint)!(bool)((byte)uVar2 & 1) *
                                              ((uint)((byte)uVar1 & 1) *
                                               (int)(auVar34._0_4_ + -6.2831855) +
                                              (uint)!(bool)((byte)uVar1 & 1) * (int)auVar34._0_4_))
                                       + fVar51) / fVar46));
    auVar7 = vinsertps_avx(auVar8,auVar7,0x10);
    auVar7 = vdivps_avx(auVar44,auVar7);
    auVar41._4_4_ = local_38;
    auVar41._0_4_ = local_38;
    auVar41._8_4_ = local_38;
    auVar41._12_4_ = local_38;
    auVar7 = vsubps_avx(auVar7,auVar41);
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar9 = vandps_avx512vl(auVar7,auVar4);
    auVar8 = vshufps_avx(auVar9,auVar9,0xf5);
    auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar25);
    uVar1 = vcmpss_avx512f(auVar25,ZEXT816(0) << 0x40,1);
    iVar5 = (uint)!(bool)((byte)uVar1 & 1) * auVar7._0_4_;
    auVar12._4_12_ = auVar7._4_12_;
    auVar12._0_4_ = iVar5;
    if (auVar8._0_4_ <= auVar9._0_4_) {
      auVar28._4_12_ = auVar11._4_12_;
      auVar28._0_4_ = iVar5;
      TVar24 = auVar28._0_8_;
    }
    else {
      auVar11 = vinsertps_avx(auVar12,ZEXT416((uint)auVar11._0_4_),0x1c);
      TVar24 = auVar11._0_8_;
    }
  }
  else {
    fVar46 = (pRect->super_Tuple3<pbrt::Point3,_float>).y - (s->super_Tuple3<pbrt::Point3,_float>).y
    ;
    fVar21 = (ex->super_Tuple3<pbrt::Vector3,_float>).x;
    fVar49 = (ex->super_Tuple3<pbrt::Vector3,_float>).y;
    auVar8 = ZEXT416((uint)((pRect->super_Tuple3<pbrt::Point3,_float>).x -
                           (s->super_Tuple3<pbrt::Point3,_float>).x));
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * fVar49)),auVar8,ZEXT416((uint)fVar21));
    fVar50 = (ex->super_Tuple3<pbrt::Vector3,_float>).z;
    auVar9 = ZEXT416((uint)((pRect->super_Tuple3<pbrt::Point3,_float>).z -
                           (s->super_Tuple3<pbrt::Point3,_float>).z));
    auVar11 = vfmadd231ss_fma(auVar11,auVar9,ZEXT416((uint)fVar50));
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar49 * fVar49)),ZEXT416((uint)fVar21),
                             ZEXT416((uint)fVar21));
    auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar50),ZEXT416((uint)fVar50));
    auVar45._0_4_ = auVar11._0_4_ / auVar7._0_4_;
    auVar45._4_12_ = auVar11._4_12_;
    fVar21 = (ey->super_Tuple3<pbrt::Vector3,_float>).x;
    fVar49 = (ey->super_Tuple3<pbrt::Vector3,_float>).y;
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * fVar49)),ZEXT416((uint)fVar21),auVar8);
    fVar50 = (ey->super_Tuple3<pbrt::Vector3,_float>).z;
    auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar50),auVar9);
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar49 * fVar49)),ZEXT416((uint)fVar21),
                             ZEXT416((uint)fVar21));
    auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar50),ZEXT416((uint)fVar50));
    auVar26._0_4_ = auVar11._0_4_ / auVar7._0_4_;
    auVar26._4_12_ = auVar11._4_12_;
    auVar11 = vinsertps_avx(auVar45,auVar26,0x10);
    TVar24 = auVar11._0_8_;
  }
  return (Point2f)TVar24;
}

Assistant:

Point2f InvertSphericalRectangleSample(const Point3f &pRef, const Point3f &s,
                                       const Vector3f &ex, const Vector3f &ey,
                                       const Point3f &pRect) {
    // TODO: Delete anything unused in the below...

    // SphQuadInit()
    // local reference system 'R'
    Float exl = Length(ex), eyl = Length(ey);
    Frame R = Frame::FromXY(ex / exl, ey / eyl);

    // compute rectangle coords in local reference system
    Vector3f d = s - pRef;
    Vector3f dLocal = R.ToLocal(d);
    Float z0 = dLocal.z;

    // flip 'z' to make it point against 'Q'
    if (z0 > 0) {
        R.z = -R.z;
        z0 *= -1;
    }
    Float z0sq = Sqr(z0);
    Float x0 = dLocal.x;
    Float y0 = dLocal.y;
    Float x1 = x0 + exl;
    Float y1 = y0 + eyl;
    Float y0sq = Sqr(y0), y1sq = Sqr(y1);

    // create vectors to four vertices
    Vector3f v00(x0, y0, z0), v01(x0, y1, z0);
    Vector3f v10(x1, y0, z0), v11(x1, y1, z0);

    // compute normals to edges
    Vector3f n0 = Normalize(Cross(v00, v10));
    Vector3f n1 = Normalize(Cross(v10, v11));
    Vector3f n2 = Normalize(Cross(v11, v01));
    Vector3f n3 = Normalize(Cross(v01, v00));

    // compute internal angles (gamma_i)
    Float g0 = AngleBetween(-n0, n1);
    Float g1 = AngleBetween(-n1, n2);
    Float g2 = AngleBetween(-n2, n3);
    Float g3 = AngleBetween(-n3, n0);

    // compute predefined constants
    Float b0 = n0.z, b1 = n2.z, b0sq = Sqr(b0), b1sq = Sqr(b1);

    // compute solid angle from internal angles
    Float solidAngle = double(g0) + double(g1) + double(g2) + double(g3) - 2. * Pi;

    // TODO: this (rarely) goes differently than sample. figure out why...
    if (solidAngle < 1e-3) {
        Vector3f pq = pRect - s;
        return Point2f(Dot(pq, ex) / LengthSquared(ex), Dot(pq, ey) / LengthSquared(ey));
    }

    Vector3f v = R.ToLocal(pRect - pRef);
    Float xu = v.x, yv = v.y;

    xu = Clamp(xu, x0, x1);  // avoid Infs
    if (xu == 0)
        xu = 1e-10;

    // DOing all this in double actually makes things slightly worse???!?
    // Float fusq = (1 - b0sq * Sqr(cu)) / Sqr(cu);
    // Float fusq = 1 / Sqr(cu) - b0sq;  // more stable
    Float invcusq = 1 + z0sq / Sqr(xu);
    Float fusq = invcusq - b0sq;  // the winner so far
    Float fu = std::copysign(std::sqrt(fusq), xu);
    // Note, though have 1 + z^2/x^2 - b0^2, which isn't great if b0 \approx 1
    // double fusq = 1. - Sqr(double(b0)) + Sqr(double(z0) / double(xu));  //
    // this is worse?? double fu = std::copysign(std::sqrt(fusq), cu);
    CHECK_RARE(1e-6, fu == 0);

    // State of the floating point world: in the bad cases, about half the
    // error seems to come from inaccuracy in fu and half comes from
    // inaccuracy in sqrt/au.
    //
    // For fu, the main issue comes adding a small value to 1+ in invcusq
    // and then having b0sq be close to one, so having catastrophic
    // cancellation affect fusq. Approximating it as z0sq / Sqr(xu) when
    // b0sq is close to one doesn't help, however..
    //
    // For au, DifferenceOfProducts doesn't seem to help with the two
    // factors. Furthermore, while it would be nice to think about this
    // like atan(y/x) and then rewrite/simplify y/x, we need to do so in a
    // way that doesn't flip the sign of x and y, which would be fine if we
    // were computing y/x, but messes up atan2's quadrant-determinations...

    Float sqrt = SafeSqrt(DifferenceOfProducts(b0, b0, b1, b1) + fusq);
    // No benefit to difference of products here...
    Float au = std::atan2(-(b1 * fu) - std::copysign(b0 * sqrt, fu * b0),
                          b0 * b1 - sqrt * std::abs(fu));
    if (au > 0)
        au -= 2 * Pi;

    if (fu == 0)
        au = Pi;
    Float u0 = (au + g2 + g3) / solidAngle;

    Float ddsq = Sqr(xu) + z0sq;
    Float dd = std::sqrt(ddsq);
    Float h0 = y0 / std::sqrt(ddsq + y0sq);
    Float h1 = y1 / std::sqrt(ddsq + y1sq);
    Float yvsq = Sqr(yv);

    Float u1[2] = {(DifferenceOfProducts(h0, h0, h0, h1) -
                    std::abs(h0 - h1) * std::sqrt(yvsq * (ddsq + yvsq)) / (ddsq + yvsq)) /
                       Sqr(h0 - h1),
                   (DifferenceOfProducts(h0, h0, h0, h1) +
                    std::abs(h0 - h1) * std::sqrt(yvsq * (ddsq + yvsq)) / (ddsq + yvsq)) /
                       Sqr(h0 - h1)};

    // TODO: yuck is there a better way to figure out which is the right
    // solution?
    Float hv[2] = {Lerp(u1[0], h0, h1), Lerp(u1[1], h0, h1)};
    Float hvsq[2] = {Sqr(hv[0]), Sqr(hv[1])};
    Float yz[2] = {(hv[0] * dd) / std::sqrt(1 - hvsq[0]),
                   (hv[1] * dd) / std::sqrt(1 - hvsq[1])};

    Point2f u = (std::abs(yz[0] - yv) < std::abs(yz[1] - yv))
                    ? Point2f(Clamp(u0, 0, 1), u1[0])
                    : Point2f(Clamp(u0, 0, 1), u1[1]);

    return u;
}